

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cigar.h
# Opt level: O3

Cigar * __thiscall Cigar::operator+(Cigar *__return_storage_ptr__,Cigar *this,Cigar *other)

{
  _Elt_pointer pCVar1;
  _Elt_pointer pCVar2;
  CigarEntry *c;
  _Elt_pointer entry;
  _Map_pointer ppCVar3;
  
  std::deque<CigarEntry,_std::allocator<CigarEntry>_>::deque
            (&__return_storage_ptr__->super_deque<CigarEntry,_std::allocator<CigarEntry>_>,
             &this->super_deque<CigarEntry,_std::allocator<CigarEntry>_>);
  entry = (other->super_deque<CigarEntry,_std::allocator<CigarEntry>_>).
          super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data.
          _M_start._M_cur;
  pCVar1 = (other->super_deque<CigarEntry,_std::allocator<CigarEntry>_>).
           super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  if (entry != pCVar1) {
    pCVar2 = (other->super_deque<CigarEntry,_std::allocator<CigarEntry>_>).
             super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppCVar3 = (other->super_deque<CigarEntry,_std::allocator<CigarEntry>_>).
              super__Deque_base<CigarEntry,_std::allocator<CigarEntry>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    do {
      Add(__return_storage_ptr__,entry);
      entry = entry + 1;
      if (entry == pCVar2) {
        entry = ppCVar3[1];
        ppCVar3 = ppCVar3 + 1;
        pCVar2 = entry + 0x40;
      }
    } while (entry != pCVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Cigar operator+( const Cigar& other ) const {
    Cigar ce = *this;
    for( auto& c : other )
      ce.Add( c );
    return ce;
  }